

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void __thiscall
gimage::BasicImageIO::load
          (BasicImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  allocator local_91;
  string local_90 [8];
  string *in_stack_ffffffffffffff78;
  IOException *in_stack_ffffffffffffff80;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,(char *)in_RDX,&local_91);
  std::operator+((char *)in_RDX,__rhs);
  std::operator+(in_RDX,(char *)__rhs);
  gutil::IOException::IOException(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  __cxa_throw(__rhs,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void BasicImageIO::load(ImageU8 &image, const char *name, int ds, long x,
                        long y, long w, long h) const
{
  throw gutil::IOException("Loading this image type is not implemented! ("+std::string(name)+")");
}